

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int parser_setup_from_fmt_ap(fy_parser *fyp,void *user)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  va_list ap_orig;
  va_list ap;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_58 = *(undefined8 *)((long)user + 0x18);
  local_68 = *(undefined8 *)((long)user + 8);
  uStack_60 = *(undefined8 *)((long)user + 0x10);
  uVar1 = vsnprintf((char *)0x0,0,*user,&local_68);
  if ((int)uVar1 < 0) {
    pcVar4 = "vsnprintf() failed";
    iVar3 = 0xba8;
  }
  else {
    pcVar4 = (char *)malloc((ulong)(uVar1 + 1));
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "malloc() failed";
      iVar3 = 0xbac;
    }
    else {
      local_38 = *(undefined8 *)((long)user + 0x18);
      local_48 = *(undefined8 *)((long)user + 8);
      uStack_40 = *(undefined8 *)((long)user + 0x10);
      uVar2 = vsnprintf(pcVar4,(ulong)(uVar1 + 1),*user,&local_48);
      if (uVar2 == uVar1) {
        pcVar4[uVar1] = '\0';
        iVar3 = fy_parser_set_malloc_string(fyp,pcVar4,(ulong)uVar1);
        return iVar3;
      }
      pcVar4 = "vsnprintf() failed";
      iVar3 = 0xbb1;
    }
  }
  fy_parser_diag(fyp,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                 ,iVar3,"parser_setup_from_fmt_ap",pcVar4);
  return -1;
}

Assistant:

static int parser_setup_from_fmt_ap(struct fy_parser *fyp, void *user) {
    struct fy_document_vbuildf_ctx *vctx = user;
    va_list ap, ap_orig;
    int size, sizew;
    char *buf;

    /* first try without allocating */
    va_copy(ap_orig, vctx->ap);
    size = vsnprintf(NULL, 0, vctx->fmt, ap_orig);
    va_end(ap_orig);

    fyp_error_check(fyp, size >= 0, err_out,
                    "vsnprintf() failed");

    buf = malloc(size + 1);
    fyp_error_check(fyp, buf, err_out,
                    "malloc() failed");

    va_copy(ap, vctx->ap);
    sizew = vsnprintf(buf, size + 1, vctx->fmt, ap);
    fyp_error_check(fyp, sizew == size, err_out,
                    "vsnprintf() failed");
    va_end(ap);

    buf[size] = '\0';

    return fy_parser_set_malloc_string(fyp, buf, size);

    err_out:
    return -1;
}